

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidDNnameConstraintsTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section13ValidDNnameConstraintsTest11
          (Section13ValidDNnameConstraintsTest11<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidDNnameConstraintsTest11) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN5CACert",
                               "ValidDNnameConstraintsTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN5CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.11";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}